

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,_unsigned_long,_4>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,unsigned_long *rhs,uchar *result)

{
  byte bVar1;
  ulong uVar2;
  undefined1 *in_RDX;
  long *in_RSI;
  byte *in_RDI;
  uint64_t tmp;
  
  uVar2 = (ulong)*in_RDI + *in_RSI;
  if (*in_RDI <= uVar2) {
    bVar1 = std::numeric_limits<unsigned_char>::max();
    if (uVar2 <= bVar1) {
      *in_RDX = (char)uVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //lhs std::uint64_t, rhs unsigned
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        // We added and it didn't get smaller
        if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }